

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  iVar2 = lhs1->exp_;
  iVar3 = lhs2->exp_;
  uVar14 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = rhs->exp_;
  iVar11 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar3;
  iVar10 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar2;
  iVar1 = iVar4 + uVar14;
  iVar8 = iVar11;
  if (iVar11 < iVar10) {
    iVar8 = iVar10;
  }
  if (iVar8 + 1 < iVar1) {
LAB_0012a7c0:
    iVar6 = -1;
  }
  else if (iVar1 < iVar8) {
LAB_0012a7ce:
    iVar6 = 1;
  }
  else {
    iVar8 = iVar2;
    if (iVar3 < iVar2) {
      iVar8 = iVar3;
    }
    if (iVar4 < iVar8) {
      iVar8 = iVar4;
    }
    iVar6 = 0;
    if (iVar8 < iVar1) {
      uVar12 = 0;
      do {
        uVar14 = uVar14 - 1;
        iVar6 = iVar4 + 1 + uVar14;
        if (iVar10 < iVar6 || iVar6 <= iVar2) {
          uVar7 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar2) + uVar14;
          if ((int)uVar5 < 0) goto LAB_0012a8f2;
          uVar7 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar11 < iVar6 || iVar6 <= iVar3) {
          uVar13 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar3) + uVar14;
          if ((int)uVar5 < 0) goto LAB_0012a8f2;
          uVar13 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar1 < iVar6 || iVar6 <= iVar4) {
          uVar9 = 0;
        }
        else {
          if ((int)uVar14 < 0) {
LAB_0012a8f2:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                        ,0x146,"negative value");
          }
          uVar9 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar14];
        }
        uVar9 = uVar9 | uVar12;
        uVar13 = uVar13 + uVar7;
        if (uVar9 < uVar13) goto LAB_0012a7ce;
        if (1 < uVar9 - uVar13) goto LAB_0012a7c0;
        uVar12 = uVar9 - uVar13 << 0x20;
      } while (iVar8 < (int)(iVar4 + uVar14));
      iVar6 = -(uint)(uVar9 != uVar13);
    }
  }
  return iVar6;
}

Assistant:

int num_bigits() const { return static_cast<int>(bigits_.size()) + exp_; }